

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QCommonArrayOps<QString>::growAppend
          (QCommonArrayOps<QString> *this,QString *b,QString *e)

{
  QString *pQVar1;
  long n;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_38;
  QString *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = b;
  if (b != e) {
    n = ((long)e - (long)b >> 3) * -0x5555555555555555;
    local_38.d = (Data *)0x0;
    local_38.ptr = (QString *)0x0;
    local_38.size = 0;
    pQVar1 = (this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>.ptr
    ;
    if ((b < pQVar1) ||
       (pQVar1 + (this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>
                 .size <= b)) {
      QArrayDataPointer<QString>::detachAndGrow
                ((QArrayDataPointer<QString> *)this,GrowsAtEnd,n,(QString **)0x0,
                 (QArrayDataPointer<QString> *)0x0);
    }
    else {
      QArrayDataPointer<QString>::detachAndGrow
                ((QArrayDataPointer<QString> *)this,GrowsAtEnd,n,&local_20,&local_38);
    }
    QGenericArrayOps<QString>::copyAppend
              ((QGenericArrayOps<QString> *)this,local_20,
               (QString *)(((long)e - (long)b) + (long)local_20));
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }